

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcontext_openssl.cpp
# Opt level: O0

void __thiscall QSslContext::QSslContext(QSslContext *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  QByteArray::QByteArray((QByteArray *)0x15d287);
  *(undefined4 *)(in_RDI + 6) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x34) = 0;
  QString::QString((QString *)0x15d2a3);
  QSslConfiguration::QSslConfiguration((QSslConfiguration *)(in_RDI + 10));
  QByteArray::QByteArray((QByteArray *)0x15d2bf);
  NPNContext::NPNContext((NPNContext *)(in_RDI + 0xe));
  return;
}

Assistant:

QSslContext::QSslContext()
    : ctx(nullptr),
    pkey(nullptr),
    session(nullptr),
    m_sessionTicketLifeTimeHint(-1)
{
}